

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::java::IsReferenceType(JavaType type)

{
  byte bVar1;
  LogMessage *pLVar2;
  LogMessage local_50 [63];
  LogFinisher local_11;
  
  if (type < (JAVATYPE_MESSAGE|JAVATYPE_LONG)) {
    bVar1 = (byte)(0x1e0 >> ((byte)type & 0x1f));
  }
  else {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x2d1);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<(local_50,"Can\'t get here.");
    google::protobuf::internal::LogFinisher::operator=(&local_11,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool IsReferenceType(JavaType type) {
  switch (type) {
    case JAVATYPE_INT:
      return false;
    case JAVATYPE_LONG:
      return false;
    case JAVATYPE_FLOAT:
      return false;
    case JAVATYPE_DOUBLE:
      return false;
    case JAVATYPE_BOOLEAN:
      return false;
    case JAVATYPE_STRING:
      return true;
    case JAVATYPE_BYTES:
      return true;
    case JAVATYPE_ENUM:
      return true;
    case JAVATYPE_MESSAGE:
      return true;

      // No default because we want the compiler to complain if any new
      // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return false;
}